

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall imrt::ACO::globalDeposit(ACO *this,Ant *a)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  double *pdVar4;
  mapped_type *pmVar5;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *in_RSI;
  long in_RDI;
  double dVar6;
  int j;
  int i;
  int ap;
  int s;
  double deposit;
  int raux;
  double in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  
  dVar6 = Ant::getEvaluation((Ant *)0x13ea62);
  local_24 = 0;
  while( true ) {
    iVar2 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0xf8));
    if (iVar2 <= local_24) break;
    for (local_28 = 0;
        local_28 < *(int *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_28 = local_28 + 1) {
      local_2c = 0;
      while( true ) {
        iVar2 = Collimator::getIntensityLevelSize((Collimator *)0x13eae1);
        if (iVar2 <= local_2c) break;
        iVar2 = Ant::getIntensityReferenceAt
                          ((Ant *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                           SUB84(in_stack_ffffffffffffffa8,0));
        pvVar3 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x70)
                            ,(long)local_24);
        pdVar4 = maths::Matrix::operator()(pvVar3,local_28,iVar2);
        dVar1 = *pdVar4;
        pvVar3 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                           ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)(in_RDI + 0x70)
                            ,(long)local_24);
        pdVar4 = maths::Matrix::operator()(pvVar3,local_28,iVar2);
        *pdVar4 = dVar1 + 1.0 / dVar6;
        local_2c = local_2c + 1;
      }
      local_30 = 0;
      while( true ) {
        in_stack_ffffffffffffffb4 = local_30;
        iVar2 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
        if (iVar2 <= in_stack_ffffffffffffffb4) break;
        iVar2 = Ant::getReferenceAt((Ant *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0),
                                    (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                    SUB84(in_stack_ffffffffffffffa8,0),0);
        std::
        vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
        ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                      *)(in_RDI + 0x28),(long)local_24);
        pmVar5 = std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](in_RSI,(key_type_conflict *)CONCAT44(iVar2,in_stack_ffffffffffffffe8))
        ;
        pdVar4 = maths::Matrix::operator()(pmVar5,local_30,iVar2);
        in_stack_ffffffffffffffa8 = *pdVar4 + 1.0 / dVar6;
        std::
        vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
        ::operator[]((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                      *)(in_RDI + 0x28),(long)local_24);
        pmVar5 = std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](in_RSI,(key_type_conflict *)CONCAT44(iVar2,in_stack_ffffffffffffffe8))
        ;
        pdVar4 = maths::Matrix::operator()(pmVar5,local_30,iVar2);
        *pdVar4 = in_stack_ffffffffffffffa8;
        local_30 = local_30 + 1;
      }
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void globalDeposit (Ant * a) {
    int raux;
    double deposit = 1/a->getEvaluation();
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int ap = 0; ap < a->n_apertures; ap++) {
        // Intensity pheromone deposit
        for (int i =0; i <  collimator.getIntensityLevelSize(); i++) {
          raux = a->getIntensityReferenceAt(s,ap);
          ipheromone[s](ap,raux) = ipheromone[s](ap,raux) + deposit;
        }
        // Aperture pheromone deposit
        for (int j = 0; j < collimator.getXdim(); j++) {
          raux = a->getReferenceAt(s,ap,j);
          (pheromone[s])[ap](j,raux) = (pheromone[s])[ap](j,raux) + deposit;
        }
      }
    }
  }